

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

optional<pbrt::QuadricIntersection> * __thiscall
pbrt::Cylinder::BasicIntersect
          (optional<pbrt::QuadricIntersection> *__return_storage_ptr__,Cylinder *this,Ray *r,
          Float tMax)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Interval<float> i;
  Interval<float> args;
  Interval<float> i_00;
  Interval<float> IVar6;
  Interval<float> i_01;
  enable_if_t<std::is_arithmetic<int>::value,_Interval<float>_> i_02;
  Interval<float> IVar7;
  float fVar5;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  Vector3fi di;
  Point3fi oi;
  undefined1 local_e8 [16];
  float local_d8;
  Interval<float> local_c0;
  undefined1 local_b8 [16];
  FloatInterval f;
  FloatInterval c;
  FloatInterval b;
  undefined8 uStack_88;
  Interval<float> local_48;
  Interval<float> local_40;
  Interval<float> local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  
  fVar26 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar8._4_4_ = fVar26;
  auVar8._0_4_ = fVar26;
  auVar8._8_4_ = fVar26;
  auVar8._12_4_ = fVar26;
  fVar26 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar27._4_4_ = fVar26;
  auVar27._0_4_ = fVar26;
  auVar27._8_4_ = fVar26;
  auVar27._12_4_ = fVar26;
  fVar26 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar30._4_4_ = fVar26;
  auVar30._0_4_ = fVar26;
  auVar30._8_4_ = fVar26;
  auVar30._12_4_ = fVar26;
  di.super_Vector3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.
  _0_16_ = vmovlhps_avx(auVar8,auVar27);
  di.super_Vector3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.z =
       (Interval<float>)vmovlps_avx(auVar30);
  Transform::operator()(&oi,this->objectFromRender,(Point3fi *)&di);
  fVar26 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
  auVar9._4_4_ = fVar26;
  auVar9._0_4_ = fVar26;
  auVar9._8_4_ = fVar26;
  auVar9._12_4_ = fVar26;
  fVar26 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar28._4_4_ = fVar26;
  auVar28._0_4_ = fVar26;
  auVar28._8_4_ = fVar26;
  auVar28._12_4_ = fVar26;
  fVar26 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar31._4_4_ = fVar26;
  auVar31._0_4_ = fVar26;
  auVar31._8_4_ = fVar26;
  auVar31._12_4_ = fVar26;
  _b = vmovlhps_avx(auVar9,auVar28);
  vmovlps_avx(auVar31);
  Transform::operator()(&di,this->objectFromRender,(Vector3fi *)&b);
  i_00 = SumSquares<float,pbrt::Interval<float>>
                   (di.super_Vector3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.x,
                    di.super_Vector3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.y);
  IVar6.high = oi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  IVar6.low = oi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar12._0_8_ = Interval<float>::operator*<float>((Interval<float> *)&di,IVar6);
  auVar12._8_56_ = extraout_var_01;
  c = (FloatInterval)vmovlps_avx(auVar12._0_16_);
  i.high = oi.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  i.low = oi.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
          .y.low;
  IVar6 = Interval<float>::operator*<float>
                    (&di.super_Vector3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.y,i);
  IVar6 = Interval<float>::operator+<float>(&c,IVar6);
  auVar13._0_8_ = pbrt::operator*(2,IVar6);
  auVar13._8_56_ = extraout_var_02;
  uVar1 = vmovlps_avx(auVar13._0_16_);
  b.low = (float)(int)uVar1;
  b.high = (float)(int)((ulong)uVar1 >> 0x20);
  IVar7.high = oi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  IVar7.low = oi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  args.high = oi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  args.low = oi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar14._0_8_ = SumSquares<float,pbrt::Interval<float>>(IVar7,args);
  auVar14._8_56_ = extraout_var_03;
  f = (FloatInterval)vmovlps_avx(auVar14._0_16_);
  i_01.high = this->radius;
  i_01.low = this->radius;
  IVar6 = Sqr<float>(i_01);
  auVar15._0_8_ = Interval<float>::operator-<float>(&f,IVar6);
  auVar15._8_56_ = extraout_var_04;
  c = (FloatInterval)vmovlps_avx(auVar15._0_16_);
  i_02 = pbrt::operator*(2,i_00);
  auVar16._0_8_ = Interval<float>::operator/<float>(&b,i_02);
  auVar16._8_56_ = extraout_var_05;
  f = (FloatInterval)vmovlps_avx(auVar16._0_16_);
  IVar6 = Interval<float>::operator*<float>
                    (&f,di.super_Vector3<pbrt::Interval<float>_>.
                        super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.x);
  IVar6 = Interval<float>::operator-<float>((Interval<float> *)&oi,IVar6);
  IVar7 = Interval<float>::operator*<float>
                    (&f,di.super_Vector3<pbrt::Interval<float>_>.
                        super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.y);
  IVar7 = Interval<float>::operator-<float>
                    (&oi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,IVar7);
  local_b8._8_8_ = extraout_XMM0_Qb;
  local_b8._0_4_ = IVar7.low;
  local_b8._4_4_ = IVar7.high;
  auVar17._0_8_ = Sqr<float>(IVar6);
  auVar17._8_56_ = extraout_var_06;
  local_c0 = (Interval<float>)vmovlps_avx(auVar17._0_16_);
  IVar6 = Sqr<float>((Interval<float>)local_b8._0_8_);
  IVar6 = Interval<float>::operator+<float>(&local_c0,IVar6);
  IVar6 = Sqrt<float>(IVar6);
  auVar18._0_8_ = pbrt::operator*(4,i_00);
  auVar18._8_56_ = extraout_var_07;
  local_48 = (Interval<float>)vmovlps_avx(auVar18._0_16_);
  local_38.low = this->radius;
  local_38.high = local_38.low;
  IVar7 = Interval<float>::operator+<float>(&local_38,IVar6);
  auVar19._0_8_ = Interval<float>::operator*<float>(&local_48,IVar7);
  auVar19._8_56_ = extraout_var_08;
  local_c0 = (Interval<float>)vmovlps_avx(auVar19._0_16_);
  local_40.low = this->radius;
  local_40.high = local_40.low;
  IVar6 = Interval<float>::operator-<float>(&local_40,IVar6);
  IVar6 = Interval<float>::operator*<float>(&local_c0,IVar6);
  if (0.0 <= IVar6.low) {
    IVar6 = Sqrt<float>(IVar6);
    if (0.0 <= (b.low + b.high) * 0.5) {
      IVar6 = Interval<float>::operator+<float>(&b,IVar6);
    }
    else {
      IVar6 = Interval<float>::operator-<float>(&b,IVar6);
    }
    auVar20._0_8_ = pbrt::operator*(-0.5,IVar6);
    auVar20._8_56_ = extraout_var_09;
    local_c0 = (Interval<float>)vmovlps_avx(auVar20._0_16_);
    IVar6 = Interval<float>::operator/<float>(&local_c0,i_00);
    local_e8._8_8_ = extraout_XMM0_Qb_00;
    local_e8._0_4_ = IVar6.low;
    local_e8._4_4_ = IVar6.high;
    auVar21._0_8_ = Interval<float>::operator/<float>(&c,local_c0);
    auVar21._8_56_ = extraout_var_10;
    auVar9 = auVar21._0_16_;
    auVar8 = local_e8;
    if (IVar6.low <= auVar21._0_4_) {
      auVar8 = auVar9;
      auVar9 = local_e8;
    }
    auVar27 = vmovshdup_avx(auVar9);
    fVar26 = auVar27._0_4_;
    if ((tMax < fVar26) || (fVar24 = auVar8._0_4_, fVar24 <= 0.0)) goto LAB_0040ec0f;
    auVar27 = vmovshdup_avx(auVar8);
    fVar5 = auVar27._0_4_;
    if ((auVar9._0_4_ <= 0.0) && (auVar9 = auVar8, fVar26 = fVar5, tMax < fVar5)) goto LAB_0040ec0f;
    fVar29 = auVar9._0_4_;
    auVar3._4_4_ = oi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    auVar3._0_4_ = oi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
    auVar3._8_4_ = oi.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
    auVar3._12_4_ =
         oi.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
         y.high;
    auVar8 = vinsertps_avx(auVar3,ZEXT416((uint)oi.super_Point3<pbrt::Interval<float>_>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
                                                .high),0x10);
    local_d8 = (fVar29 + fVar26) * 0.5;
    auVar9 = vinsertps_avx((undefined1  [16])
                           di.super_Vector3<pbrt::Interval<float>_>.
                           super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>._0_16_,
                           ZEXT416((uint)di.super_Vector3<pbrt::Interval<float>_>.
                                         super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.y.high)
                           ,0x10);
    fVar34 = (oi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
             oi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5 +
             local_d8 *
             (di.super_Vector3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.z.low +
             di.super_Vector3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.z.high) * 0.5;
    auVar10._0_4_ =
         (oi.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
          .x.high + auVar8._0_4_) * 0.5 +
         local_d8 *
         (di.super_Vector3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.x.high + auVar9._0_4_) * 0.5;
    auVar10._4_4_ =
         (oi.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
          .y.low + auVar8._4_4_) * 0.5 +
         local_d8 *
         (di.super_Vector3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.y.low + auVar9._4_4_) * 0.5;
    auVar10._8_4_ = (auVar8._8_4_ + 0.0) * 0.5 + local_d8 * (auVar9._8_4_ + 0.0) * 0.5;
    auVar10._12_4_ = (auVar8._12_4_ + 0.0) * 0.5 + local_d8 * (auVar9._12_4_ + 0.0) * 0.5;
    auVar32._0_4_ = auVar10._0_4_ * auVar10._0_4_;
    auVar32._4_4_ = auVar10._4_4_ * auVar10._4_4_;
    auVar32._8_4_ = auVar10._8_4_ * auVar10._8_4_;
    auVar32._12_4_ = auVar10._12_4_ * auVar10._12_4_;
    auVar8 = vmovshdup_avx(auVar32);
    auVar8 = vfmadd231ss_fma(auVar8,auVar10,auVar10);
    auVar8 = vsqrtss_avx(auVar8,auVar8);
    fVar25 = this->radius / auVar8._0_4_;
    local_b8._0_4_ = auVar10._0_4_ * fVar25;
    local_b8._4_4_ = auVar10._4_4_ * fVar25;
    local_b8._8_4_ = auVar10._8_4_ * fVar25;
    local_b8._12_4_ = auVar10._12_4_ * fVar25;
    auVar8 = vmovshdup_avx(local_b8);
    auVar22._0_4_ = atan2f(auVar8._0_4_,(float)local_b8._0_4_);
    auVar22._4_60_ = extraout_var;
    if ((this->zMin <= fVar34) && (fVar34 <= this->zMax)) {
      uVar1 = vcmpss_avx512f(auVar22._0_16_,ZEXT816(0) << 0x40,1);
      bVar2 = (bool)((byte)uVar1 & 1);
      fVar25 = (float)((uint)bVar2 * (int)(auVar22._0_4_ + 6.2831855) +
                      (uint)!bVar2 * (int)auVar22._0_4_);
      if (fVar25 <= this->phiMax) goto LAB_0040ebae;
    }
    if ((fVar29 == fVar24) && (!NAN(fVar29) && !NAN(fVar24))) {
      if ((fVar26 == fVar5) && (!NAN(fVar26) && !NAN(fVar5))) goto LAB_0040ec0f;
    }
    if (fVar5 <= tMax) {
      auVar4._4_4_ = oi.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
      auVar4._0_4_ = oi.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
      auVar4._8_4_ = oi.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
      auVar4._12_4_ =
           oi.super_Point3<pbrt::Interval<float>_>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
      auVar8 = vinsertps_avx(auVar4,ZEXT416((uint)oi.super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.high),0x10);
      local_d8 = (fVar24 + fVar5) * 0.5;
      auVar9 = vinsertps_avx((undefined1  [16])
                             di.super_Vector3<pbrt::Interval<float>_>.
                             super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>._0_16_,
                             ZEXT416((uint)di.super_Vector3<pbrt::Interval<float>_>.
                                           super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.y.
                                           high),0x10);
      fVar34 = (oi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
               oi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5 +
               local_d8 *
               (di.super_Vector3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.z.low +
               di.super_Vector3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.z.high) * 0.5;
      auVar11._0_4_ =
           (oi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar8._0_4_) * 0.5 +
           local_d8 *
           (di.super_Vector3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.x.high + auVar9._0_4_) * 0.5;
      auVar11._4_4_ =
           (oi.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar8._4_4_) * 0.5 +
           local_d8 *
           (di.super_Vector3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.y.low + auVar9._4_4_) * 0.5;
      auVar11._8_4_ = (auVar8._8_4_ + 0.0) * 0.5 + local_d8 * (auVar9._8_4_ + 0.0) * 0.5;
      auVar11._12_4_ = (auVar8._12_4_ + 0.0) * 0.5 + local_d8 * (auVar9._12_4_ + 0.0) * 0.5;
      auVar33._0_4_ = auVar11._0_4_ * auVar11._0_4_;
      auVar33._4_4_ = auVar11._4_4_ * auVar11._4_4_;
      auVar33._8_4_ = auVar11._8_4_ * auVar11._8_4_;
      auVar33._12_4_ = auVar11._12_4_ * auVar11._12_4_;
      auVar8 = vmovshdup_avx(auVar33);
      auVar8 = vfmadd231ss_fma(auVar8,auVar11,auVar11);
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      fVar26 = this->radius / auVar8._0_4_;
      local_b8._0_4_ = auVar11._0_4_ * fVar26;
      local_b8._4_4_ = auVar11._4_4_ * fVar26;
      local_b8._8_4_ = auVar11._8_4_ * fVar26;
      local_b8._12_4_ = auVar11._12_4_ * fVar26;
      auVar8 = vmovshdup_avx(local_b8);
      auVar23._0_4_ = atan2f(auVar8._0_4_,(float)local_b8._0_4_);
      auVar23._4_60_ = extraout_var_00;
      if ((this->zMin <= fVar34) && (fVar34 <= this->zMax)) {
        uVar1 = vcmpss_avx512f(auVar23._0_16_,ZEXT816(0) << 0x40,1);
        bVar2 = (bool)((byte)uVar1 & 1);
        fVar25 = (float)((uint)bVar2 * (int)(auVar23._0_4_ + 6.2831855) +
                        (uint)!bVar2 * (int)auVar23._0_4_);
        if (fVar25 <= this->phiMax) {
LAB_0040ebae:
          __return_storage_ptr__->set = true;
          *(float *)&__return_storage_ptr__->optionalValue = local_d8;
          uVar1 = vmovlps_avx(local_b8);
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 4) = uVar1;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0xc) = fVar34;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0x10) = fVar25;
          return __return_storage_ptr__;
        }
      }
    }
  }
LAB_0040ec0f:
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<QuadricIntersection> BasicIntersect(const Ray &r, Float tMax) const {
        Float phi;
        Point3f pHit;
        // Transform _Ray_ origin and direction to object space
        Point3fi oi = (*objectFromRender)(Point3fi(r.o));
        Vector3fi di = (*objectFromRender)(Vector3fi(r.d));

        // Solve quadratic equation to find cylinder _t0_ and _t1_ values
        FloatInterval t0, t1;
        // Compute cylinder quadratic coefficients
        FloatInterval a = SumSquares(di.x, di.y);
        FloatInterval b = 2 * (di.x * oi.x + di.y * oi.y);
        FloatInterval c = SumSquares(oi.x, oi.y) - Sqr(FloatInterval(radius));

        // Compute cylinder quadratic discriminant _discrim_
        FloatInterval f = b / (2 * a);
        FloatInterval fx = oi.x - f * di.x, fy = oi.y - f * di.y;
        FloatInterval sqrtf = Sqrt(Sqr(fx) + Sqr(fy));
        FloatInterval discrim =
            4 * a * (FloatInterval(radius) + sqrtf) * (FloatInterval(radius) - sqrtf);
        if (discrim.LowerBound() < 0)
            return {};

        // Compute quadratic $t$ values
        FloatInterval rootDiscrim = Sqrt(discrim);
        FloatInterval q;
        if ((Float)b < 0)
            q = -.5f * (b - rootDiscrim);
        else
            q = -.5f * (b + rootDiscrim);
        t0 = q / a;
        t1 = c / q;
        // Swap quadratic $t$ values so that _t0_ is the lesser
        if (t0.LowerBound() > t1.LowerBound())
            pstd::swap(t0, t1);

        // Check quadric shape _t0_ and _t1_ for nearest intersection
        if (t0.UpperBound() > tMax || t1.LowerBound() <= 0)
            return {};
        FloatInterval tShapeHit = t0;
        if (tShapeHit.LowerBound() <= 0) {
            tShapeHit = t1;
            if (tShapeHit.UpperBound() > tMax)
                return {};
        }

        // Compute cylinder hit point and $\phi$
        pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
        // Refine cylinder intersection point
        Float hitRad = std::sqrt(pHit.x * pHit.x + pHit.y * pHit.y);
        pHit.x *= radius / hitRad;
        pHit.y *= radius / hitRad;

        phi = std::atan2(pHit.y, pHit.x);
        if (phi < 0)
            phi += 2 * Pi;

        // Test cylinder intersection against clipping parameters
        if (pHit.z < zMin || pHit.z > zMax || phi > phiMax) {
            if (tShapeHit == t1)
                return {};
            tShapeHit = t1;
            if (t1.UpperBound() > tMax)
                return {};
            // Compute cylinder hit point and $\phi$
            pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
            // Refine cylinder intersection point
            Float hitRad = std::sqrt(pHit.x * pHit.x + pHit.y * pHit.y);
            pHit.x *= radius / hitRad;
            pHit.y *= radius / hitRad;

            phi = std::atan2(pHit.y, pHit.x);
            if (phi < 0)
                phi += 2 * Pi;

            if (pHit.z < zMin || pHit.z > zMax || phi > phiMax)
                return {};
        }

        // Return _QuadricIntersection_ for cylinder intersection
        return QuadricIntersection{(Float)tShapeHit, pHit, phi};
    }